

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap_F.cpp
# Opt level: O3

void __thiscall
amrex::MLEBABecLap::Fapply(MLEBABecLap *this,int amrlev,int mglev,MultiFab *out,MultiFab *in)

{
  long *plVar1;
  double dVar2;
  double dVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  int iVar7;
  Location LVar8;
  Location LVar9;
  int iVar10;
  int iVar11;
  MLEBABecLap *pMVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint ncomp;
  FabType FVar23;
  uint uVar24;
  long lVar25;
  int *piVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  void *__s;
  long lVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  bool bVar35;
  Box tbx;
  MFIter mfi;
  ulong local_e28;
  Box local_e0c;
  MLEBABecLap *local_df0;
  FabArray<amrex::EBCellFlagFab> *local_de8;
  ulong local_de0;
  double local_dd8;
  undefined8 uStack_dd0;
  double *local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  long lStack_db0;
  ulong local_da8;
  ulong local_da0;
  long local_d98;
  double *local_d90;
  int local_d88;
  int local_d84;
  int local_d80;
  int local_d7c;
  int local_d78;
  int local_d74;
  int local_d70;
  int local_d6c;
  long local_d68;
  long local_d60;
  undefined8 *local_d58;
  undefined8 *local_d50;
  undefined8 *local_d48;
  undefined8 *local_d40;
  long *local_d38;
  long *local_d30;
  long *local_d28;
  long *local_d20;
  long *local_d18;
  MultiCutFab *local_d10;
  MultiCutFab *local_d08;
  MultiCutFab *local_d00;
  FabArray<amrex::FArrayBox> *local_cf8;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_cf0;
  Real local_ce8;
  FabArray<amrex::FArrayBox> *local_ce0;
  ulong local_cd8;
  long local_cd0;
  Array4<double> local_cc8;
  MultiCutFab *local_c88;
  MultiCutFab *pMStack_c80;
  MultiCutFab *local_c78;
  MultiCutFab *local_c68;
  MultiCutFab *pMStack_c60;
  MultiCutFab *local_c58;
  long local_c48;
  FabArray<amrex::IArrayBox> *local_c40;
  FabArray<amrex::FArrayBox> *local_c38;
  FabArray<amrex::FArrayBox> *local_c30;
  FabArray<amrex::FArrayBox> *local_c28;
  FabArray<amrex::FArrayBox> *local_c20;
  FabArray<amrex::FArrayBox> *local_c18;
  ulong local_c10;
  long local_c08;
  ulong local_c00;
  ulong local_bf8;
  long local_bf0;
  long local_be8;
  long local_be0;
  long local_bd8;
  long local_bd0;
  long local_bc8;
  long local_bc0;
  long local_bb8;
  long local_bb0;
  long local_ba8;
  long local_ba0;
  long local_b98;
  long local_b90;
  long local_b88;
  ulong local_b80;
  long local_b78;
  long local_b70;
  long local_b68;
  long local_b60;
  long local_b58;
  long local_b50;
  long local_b48;
  long local_b40;
  Array4<const_double> local_b38;
  Array4<const_double> local_af8;
  Array4<const_double> local_ab8;
  Array4<const_double> local_a78;
  Array4<const_double> local_a38;
  undefined1 local_9f8 [32];
  double *local_9d8;
  int local_9d0;
  int local_9cc;
  int iStack_9c8;
  int iStack_9c4;
  int iStack_9c0;
  undefined1 local_9b8 [32];
  double *local_998;
  int local_990;
  int local_98c;
  int iStack_988;
  int iStack_984;
  int iStack_980;
  Box local_978;
  double local_958;
  undefined8 uStack_950;
  double local_948;
  undefined8 uStack_940;
  double local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  double *local_918;
  ulong uStack_910;
  double *local_908;
  ulong uStack_900;
  undefined1 local_8f8 [40];
  int iStack_8d0;
  int iStack_8cc;
  int iStack_8c8;
  undefined8 uStack_8c4;
  undefined1 local_8b8 [40];
  int iStack_890;
  int iStack_88c;
  int iStack_888;
  undefined8 uStack_884;
  undefined1 local_878 [40];
  int iStack_850;
  int iStack_84c;
  int iStack_848;
  undefined8 uStack_844;
  Array4<const_double> local_838;
  Array4<const_double> local_7f8;
  Array4<const_double> local_7b8;
  Array4<const_double> local_778;
  Array4<const_double> local_738;
  Array4<const_double> local_6f8;
  Array4<const_amrex::EBCellFlag> local_6b8;
  int local_678;
  int iStack_674;
  int iStack_670;
  int iStack_66c;
  undefined1 local_668 [16];
  undefined1 local_658 [16];
  double local_648;
  undefined8 uStack_640;
  MFIter local_630;
  Array4<const_double> local_5d0;
  Array4<const_int> local_590;
  MFItInfo local_54c;
  undefined1 local_538 [865];
  bool local_1d7;
  bool local_1d6;
  undefined1 uStack_1d5;
  int local_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int iStack_1c8;
  undefined4 uStack_1c4;
  double *local_1c0;
  Long LStack_1b8;
  Long local_1b0;
  int iStack_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int iStack_198;
  int iStack_190;
  int iStack_18c;
  int iStack_188;
  undefined4 uStack_184;
  double *local_180;
  Long LStack_178;
  double *local_170;
  int iStack_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int iStack_158;
  bool bStack_150;
  bool bStack_14f;
  undefined2 uStack_14e;
  int iStack_14c;
  int iStack_148;
  undefined4 uStack_144;
  undefined8 local_140;
  double *local_138;
  ulong uStack_130;
  double *local_128;
  int iStack_120;
  int iStack_11c;
  int iStack_118;
  int iStack_114;
  int iStack_110;
  int iStack_108;
  int iStack_104;
  int iStack_100;
  undefined4 uStack_fc;
  double *local_f8;
  Long LStack_f0;
  double *local_e8;
  int iStack_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_c8;
  int iStack_c4;
  int iStack_c0;
  undefined4 uStack_bc;
  double *local_b8;
  Long LStack_b0;
  double *local_a8;
  int iStack_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_88;
  int iStack_84;
  int iStack_80;
  undefined4 uStack_7c;
  double *local_78;
  ulong uStack_70;
  double *local_68;
  int iStack_60;
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  int local_4c;
  int iStack_48;
  int iStack_44;
  int iStack_40;
  
  local_d68 = (long)amrlev;
  local_d60 = (long)mglev;
  local_c20 = (FabArray<amrex::FArrayBox> *)
              (*(long *)&(this->m_a_coeffs).
                         super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_d68].
                         super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> +
              local_d60 * 0x180);
  lVar29 = *(long *)&(this->m_b_coeffs).
                     super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_d68].
                     super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                     .
                     super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ;
  local_c40 = (FabArray<amrex::IArrayBox> *)
              (local_d60 * 0x180 +
              *(long *)&(this->m_cc_mask).
                        super_vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_d68].
                        super_vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>.
                        super__Vector_base<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>);
  lVar25 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_d68].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar34 = local_d60 * 200;
  local_dd8 = *(double *)(lVar25 + 0x38 + lVar34);
  uStack_dd0 = 0;
  local_dc8 = *(double **)(lVar25 + 0x40 + lVar34);
  uStack_dc0 = 0;
  dVar2 = *(double *)(lVar25 + 0x48 + lVar34);
  lVar25 = *(long *)(*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory
                               .
                               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[local_d68].
                               super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    + local_d60 * 8);
  local_df0 = this;
  local_d80 = mglev;
  local_ce0 = &out->super_FabArray<amrex::FArrayBox>;
  local_c18 = &in->super_FabArray<amrex::FArrayBox>;
  if ((lVar25 == 0) ||
     (lVar25 = __dynamic_cast(lVar25,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo,0), lVar25 == 0)) {
    local_c68 = (MultiCutFab *)0x0;
    pMStack_c60 = (MultiCutFab *)0x0;
    local_c58 = (MultiCutFab *)0x0;
    local_d08 = (MultiCutFab *)0x0;
    local_c78 = (MultiCutFab *)0x0;
    local_c88 = (MultiCutFab *)0x0;
    pMStack_c80 = (MultiCutFab *)0x0;
    local_cf8 = (FabArray<amrex::FArrayBox> *)0x0;
    local_de8 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    local_d00 = (MultiCutFab *)0x0;
    local_d10 = (MultiCutFab *)0x0;
  }
  else {
    local_de8 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar25 + 0xd8));
    local_cf8 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar25 + 0xd8))->
                 super_FabArray<amrex::FArrayBox>;
    EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar25 + 0xd8));
    EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar25 + 0xd8));
    local_d00 = EBDataCollection::getBndryArea(*(EBDataCollection **)(lVar25 + 0xd8));
    local_d08 = EBDataCollection::getBndryCent(*(EBDataCollection **)(lVar25 + 0xd8));
    local_d10 = EBDataCollection::getCentroid(*(EBDataCollection **)(lVar25 + 0xd8));
  }
  pMVar12 = local_df0;
  local_cf0._M_head_impl =
       *(MultiFab **)
        &(((local_df0->m_eb_phi).
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  iVar7 = local_df0->m_is_eb_inhomog;
  ncomp = (*(local_df0->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])
                    (local_df0);
  local_918 = (double *)0x0;
  uStack_910 = 0;
  local_908 = (double *)0x0;
  uStack_900 = 0;
  local_928 = 0;
  uStack_920._0_4_ = 0;
  uStack_920._4_4_ = 0;
  local_ce8 = pMVar12->m_a_scalar;
  dVar3 = pMVar12->m_b_scalar;
  local_c48 = local_d68 * 3;
  lVar25 = *(long *)&(pMVar12->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_d68].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  local_d84 = *(int *)(lVar25 + 0xac + lVar34);
  plVar1 = (long *)(lVar25 + 0xb0 + lVar34);
  local_db8 = (double *)*plVar1;
  lStack_db0 = plVar1[1];
  local_d88 = *(int *)(lVar25 + 0xc0 + lVar34);
  uVar4 = *(undefined1 *)(lVar25 + 0x51 + lVar34);
  uVar5 = *(undefined1 *)(lVar25 + 0x52 + lVar34);
  uVar6 = *(undefined1 *)(lVar25 + 0x53 + lVar34);
  local_54c.dynamic = true;
  local_54c.device_sync = true;
  local_54c.num_streams = Gpu::Device::max_gpu_streams;
  local_54c.do_tiling = true;
  local_54c.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_54c.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_54c.tilesize.vect[2] = DAT_00810ec0;
  MFIter::MFIter(&local_630,&local_ce0->super_FabArrayBase,&local_54c);
  if (local_630.currentIndex < local_630.endIndex) {
    lVar25 = local_d60 * 0x480;
    local_c28 = (FabArray<amrex::FArrayBox> *)(lVar29 + lVar25);
    local_c30 = (FabArray<amrex::FArrayBox> *)(lVar29 + lVar25 + 0x180);
    local_c38 = (FabArray<amrex::FArrayBox> *)(lVar25 + lVar29 + 0x300);
    bVar35 = local_cf0._M_head_impl != (MultiFab *)0x0;
    local_938 = local_dd8 * dVar3 * local_dd8;
    uStack_930 = uStack_dd0;
    local_948 = (double)local_dc8 * dVar3 * (double)local_dc8;
    uStack_940 = uStack_dc0;
    local_958 = dVar2 * dVar3 * dVar2;
    uStack_950 = 0;
    local_d18 = (long *)(local_538 + 0x88);
    local_d20 = (long *)(local_538 + 200);
    local_d28 = (long *)(local_538 + 0x110);
    local_d30 = (long *)(local_538 + 0x158);
    local_d38 = (long *)(local_538 + 0x1a0);
    local_d40 = (undefined8 *)(local_538 + 0x1e0);
    local_658._8_4_ = (int)uStack_dd0;
    local_658._0_8_ = -local_dd8 * dVar3 * local_dd8;
    local_658._12_4_ = (uint)((ulong)uStack_dd0 >> 0x20) ^ 0x80000000;
    local_668._8_4_ = (int)uStack_dc0;
    local_668._0_8_ = -(double)local_dc8 * dVar3 * (double)local_dc8;
    local_668._12_4_ = (uint)((ulong)uStack_dc0 >> 0x20) ^ 0x80000000;
    uStack_640 = 0x8000000000000000;
    local_648 = -dVar2 * dVar3 * dVar2;
    local_678 = (int)lStack_db0;
    iStack_674 = (int)local_db8;
    iStack_670 = local_db8._4_4_;
    iStack_66c = local_db8._4_4_;
    local_d48 = (undefined8 *)(local_538 + 0x220);
    local_d50 = (undefined8 *)(local_538 + 0x260);
    local_d58 = (undefined8 *)(local_538 + 0x2a0);
    local_cd8 = (ulong)ncomp;
    do {
      MFIter::tilebox(&local_e0c,&local_630);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_a78,local_c18,&local_630);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_cc8,local_ce0,&local_630);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_a38,local_c20,&local_630);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_ab8,local_c28,&local_630);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_af8,local_c30,&local_630);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_b38,local_c38,&local_630);
      if (local_de8 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
LAB_006d701f:
        if (0 < (int)ncomp) {
          local_c10 = (ulong)(uint)local_e0c.bigend.vect[2];
          local_c00 = (ulong)(uint)local_e0c.bigend.vect[1];
          local_be8 = (long)local_e0c.smallend.vect[1];
          local_bf0 = (long)local_e0c.smallend.vect[0];
          local_d70 = local_e0c.bigend.vect[1] + 1;
          local_d74 = local_e0c.bigend.vect[2] + 1;
          local_c08 = local_bf0 * 8;
          local_d7c = local_e0c.smallend.vect[0] + -1;
          uVar24 = (local_e0c.bigend.vect[0] - local_e0c.smallend.vect[0]) + 1;
          local_bf8 = (ulong)uVar24;
          local_cd0 = 0;
          local_da8 = 0;
          local_d6c = local_e0c.bigend.vect[0];
          do {
            iVar30 = local_e0c.smallend.vect[2];
            if (local_e0c.smallend.vect[2] <= local_e0c.bigend.vect[2]) {
              do {
                if (local_e0c.smallend.vect[1] <= local_e0c.bigend.vect[1]) {
                  local_db8 = local_a78.p;
                  local_dc8 = (double *)(long)local_a78.begin.x;
                  local_d78 = iVar30 + 1;
                  local_da0 = (long)local_cc8.p +
                              local_cc8.nstride * local_cd0 +
                              (iVar30 - local_cc8.begin.z) * local_cc8.kstride * 8 +
                              (long)local_cc8.begin.x * -8 + local_c08;
                  local_de0 = local_a78.kstride * (iVar30 - local_a78.begin.z);
                  local_d90 = local_a38.p +
                              local_bf0 +
                              ((iVar30 - local_a38.begin.z) * local_a38.kstride -
                              (long)local_a38.begin.x);
                  local_b48 = (long)local_b38.p +
                              (long)(iVar30 - local_b38.begin.z) * local_b38.kstride * 8 +
                              local_b38.nstride * local_cd0 + (long)local_b38.begin.x * -8 +
                              local_c08;
                  local_b40 = (long)local_b38.p +
                              local_b38.kstride * 8 * (long)(local_d78 - local_b38.begin.z) +
                              local_b38.nstride * local_cd0 + (long)local_b38.begin.x * -8 +
                              local_c08;
                  local_b50 = (long)local_af8.p +
                              local_af8.nstride * local_cd0 +
                              (iVar30 - local_af8.begin.z) * local_af8.kstride * 8 +
                              (long)local_af8.begin.x * -8 + local_c08;
                  local_b58 = (long)local_ab8.p +
                              local_ab8.nstride * local_cd0 +
                              (iVar30 - local_ab8.begin.z) * local_ab8.kstride * 8 +
                              (long)local_ab8.begin.x * -8 + local_c08;
                  lVar25 = local_a78.kstride * 8;
                  lVar29 = local_a78.nstride * local_cd0;
                  local_dd8 = (double)(ulong)(uint)(local_d7c - local_a78.begin.x);
                  local_b68 = (long)local_a78.p +
                              (~local_a78.begin.z + iVar30) * lVar25 + lVar29 + (long)local_dc8 * -8
                              + local_c08;
                  local_b60 = (long)local_a78.p +
                              (local_d78 - local_a78.begin.z) * lVar25 + lVar29 +
                              (long)local_dc8 * -8 + local_c08;
                  local_d98 = (long)local_a78.p +
                              lVar25 * (iVar30 - local_a78.begin.z) + lVar29 + (long)local_dc8 * -8
                              + local_c08;
                  local_b78 = (long)local_a78.begin.y;
                  local_b70 = local_a78.nstride * local_da8;
                  local_b80 = (ulong)(uint)~local_a78.begin.y;
                  local_b88 = local_cc8.jstride * 8;
                  local_b90 = local_a38.jstride * 8;
                  local_b98 = local_b38.jstride * 8;
                  local_ba0 = local_af8.jstride * 8;
                  local_ba8 = local_ab8.jstride * 8;
                  local_bb0 = (long)local_a38.begin.y;
                  local_bc0 = (long)local_ab8.begin.y;
                  local_bc8 = (long)local_af8.begin.y;
                  local_bd0 = (long)local_b38.begin.y;
                  local_bd8 = (long)local_cc8.begin.y;
                  local_bb8 = local_a78.jstride;
                  local_be0 = local_a78.jstride * 8;
                  lVar29 = local_be8;
                  do {
                    if (local_e0c.smallend.vect[0] <= local_e0c.bigend.vect[0]) {
                      local_dc8 = (double *)((lVar29 - local_bb0) * local_b90 + (long)local_d90);
                      lVar34 = (lVar29 - local_bc0) * local_ba8 + local_b58;
                      lVar25 = (lVar29 - local_bd0) * local_b98;
                      lVar33 = (lVar29 - local_b78) * local_be0;
                      lVar31 = 0;
                      do {
                        dVar2 = *(double *)(lVar33 + local_d98 + lVar31 * 8);
                        *(double *)((lVar29 - local_bd8) * local_b88 + local_da0 + lVar31 * 8) =
                             ((*(double *)(local_b60 + lVar33 + lVar31 * 8) - dVar2) *
                              *(double *)(lVar25 + local_b40 + lVar31 * 8) -
                             (dVar2 - *(double *)(local_b68 + lVar33 + lVar31 * 8)) *
                             *(double *)(local_b48 + lVar25 + lVar31 * 8)) * local_648 +
                             ((*(double *)
                                (((lVar29 + 1) - local_b78) * local_be0 + local_d98 + lVar31 * 8) -
                              dVar2) * *(double *)
                                        (((lVar29 + 1) - local_bc8) * local_ba0 + local_b50 +
                                        lVar31 * 8) -
                             (dVar2 - *(double *)
                                       ((~local_a78.begin.y + (int)lVar29) * local_be0 + local_d98 +
                                       lVar31 * 8)) *
                             *(double *)((lVar29 - local_bc8) * local_ba0 + local_b50 + lVar31 * 8))
                             * (double)local_668._0_8_ +
                             local_dc8[lVar31] * local_ce8 * dVar2 +
                             ((*(double *)(lVar33 + local_d98 + 8 + lVar31 * 8) - dVar2) *
                              *(double *)(lVar34 + 8 + lVar31 * 8) -
                             (dVar2 - local_a78.p
                                      [local_a78.jstride * (lVar29 - local_b78) +
                                       local_de0 +
                                       local_b70 + ((local_d7c - local_a78.begin.x) + (int)lVar31)])
                             * *(double *)(lVar34 + lVar31 * 8)) * (double)local_658._0_8_;
                        lVar31 = lVar31 + 1;
                      } while (uVar24 != (uint)lVar31);
                    }
                    lVar29 = lVar29 + 1;
                  } while (local_d70 != (int)lVar29);
                }
                iVar30 = iVar30 + 1;
              } while (iVar30 != local_d74);
            }
            local_da8 = local_da8 + 1;
            local_cd0 = local_cd0 + 8;
          } while (local_da8 != local_cd8);
        }
      }
      else {
        piVar26 = &local_630.currentIndex;
        if (local_630.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar26 = ((local_630.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_630.currentIndex;
        }
        FVar23 = EBCellFlagFab::getType
                           ((local_de8->m_fabs_v).
                            super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[*piVar26],&local_e0c);
        iVar11 = local_e0c.bigend.vect[1];
        iVar10 = local_e0c.bigend.vect[0];
        iVar30 = local_e0c.smallend.vect[0];
        if (FVar23 == regular) goto LAB_006d701f;
        if (FVar23 == covered) {
          if (0 < (int)ncomp) {
            local_de0 = CONCAT44(local_de0._4_4_,local_e0c.smallend.vect[2]);
            local_dd8 = (double)CONCAT44(local_dd8._4_4_,local_e0c.bigend.vect[2]);
            local_dc8 = (double *)(long)local_e0c.smallend.vect[1];
            local_d90 = (double *)((long)local_e0c.smallend.vect[0] << 3);
            uVar24 = local_e0c.bigend.vect[0] - local_e0c.smallend.vect[0];
            local_d98 = CONCAT44(local_d98._4_4_,
                                 (local_e0c.bigend.vect[1] - local_e0c.smallend.vect[1]) + 1);
            local_db8 = (double *)0x0;
            uVar27 = 0;
            do {
              local_da0 = uVar27;
              if ((int)local_de0 <= local_dd8._0_4_) {
                local_e28 = local_de0 & 0xffffffff;
                do {
                  iVar28 = (int)local_e28;
                  if ((int)local_dc8 <= iVar11) {
                    lVar29 = local_cc8.jstride * 8;
                    __s = (void *)((long)local_cc8.p +
                                  local_cc8.nstride * (long)local_db8 +
                                  ((long)local_dc8 - (long)local_cc8.begin.y) * lVar29 +
                                  (iVar28 - local_cc8.begin.z) * local_cc8.kstride * 8 +
                                  (long)local_cc8.begin.x * -8 + (long)local_d90);
                    iVar32 = (int)local_d98;
                    do {
                      if (iVar30 <= iVar10) {
                        memset(__s,0,(ulong)uVar24 * 8 + 8);
                      }
                      __s = (void *)((long)__s + lVar29);
                      iVar32 = iVar32 + -1;
                    } while (iVar32 != 0);
                  }
                  local_e28 = (ulong)(iVar28 + 1);
                } while (iVar28 != local_dd8._0_4_);
              }
              uVar27 = local_da0 + 1;
              local_db8 = local_db8 + 1;
            } while (uVar27 != local_cd8);
          }
        }
        else {
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    (&local_590,local_c40,&local_630);
          FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                    (&local_6b8,local_de8,&local_630);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_6f8,local_cf8,&local_630);
          MultiCutFab::const_array(&local_738,local_c68,&local_630);
          MultiCutFab::const_array(&local_778,pMStack_c60,&local_630);
          MultiCutFab::const_array(&local_7b8,local_c58,&local_630);
          MultiCutFab::const_array(&local_7f8,local_c88,&local_630);
          MultiCutFab::const_array(&local_838,pMStack_c80,&local_630);
          MultiCutFab::const_array((Array4<const_double> *)local_878,local_c78,&local_630);
          MultiCutFab::const_array((Array4<const_double> *)local_8b8,local_d00,&local_630);
          MultiCutFab::const_array((Array4<const_double> *)local_8f8,local_d08,&local_630);
          MultiCutFab::const_array(&local_5d0,local_d10,&local_630);
          pMVar12 = local_df0;
          if (local_cf0._M_head_impl == (MultiFab *)0x0) {
            local_9b8._16_8_ = local_908;
            local_9b8._24_8_ = uStack_900;
            local_9b8._0_8_ = local_918;
            local_9b8._8_8_ = uStack_910;
            local_998 = (double *)0x100000001;
            local_990 = 1;
            local_98c = (int)local_928;
            iStack_988 = (int)((ulong)local_928 >> 0x20);
            iStack_984 = (int)uStack_920;
            iStack_980 = uStack_920._4_4_;
LAB_006d7928:
            local_9f8._16_8_ = local_908;
            local_9f8._24_8_ = uStack_900;
            local_9f8._0_8_ = local_918;
            local_9f8._8_8_ = uStack_910;
            local_9d8 = (double *)0x100000001;
            local_9d0 = 1;
            local_9cc = (int)local_928;
            iStack_9c8 = (int)((ulong)local_928 >> 0x20);
            iStack_9c4 = (int)uStack_920;
            iStack_9c0 = uStack_920._4_4_;
          }
          else {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      ((Array4<const_double> *)local_9b8,
                       (FabArray<amrex::FArrayBox> *)
                       (&(((local_df0->m_eb_b_coeffs).
                           super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ).
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)[local_c48][local_d60]._M_t,
                       &local_630);
            if (iVar7 == 0) goto LAB_006d7928;
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      ((Array4<const_double> *)local_9f8,
                       (FabArray<amrex::FArrayBox> *)
                       (pMVar12->m_eb_phi).
                       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_d68]._M_t.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ,&local_630);
          }
          iVar11 = iStack_14c;
          LVar8 = pMVar12->m_phi_loc;
          local_538._812_4_ = local_7f8.end.z;
          uVar15 = local_538._812_4_;
          local_538._816_4_ = local_7f8.ncomp;
          uVar16 = local_538._816_4_;
          local_538._776_4_ = (undefined4)local_7f8.kstride;
          uVar13 = local_538._776_4_;
          local_538._780_4_ = (undefined4)((ulong)local_7f8.kstride >> 0x20);
          uVar14 = local_538._780_4_;
          iStack_1cc = (int)_iStack_9c4;
          iVar30 = iStack_1cc;
          iStack_1c8 = SUB84(_iStack_9c4,4);
          iVar10 = iStack_1c8;
          iStack_14c = (int)uStack_8c4;
          iVar28 = iStack_14c;
          iStack_148 = SUB84(uStack_8c4,4);
          iVar32 = iStack_148;
          iStack_104 = local_838.end.z;
          iVar17 = iStack_104;
          iStack_100 = local_838.ncomp;
          iVar18 = iStack_100;
          iStack_c4 = (int)uStack_844;
          iVar19 = iStack_c4;
          iStack_c0 = SUB84(uStack_844,4);
          iVar20 = iStack_c0;
          iStack_84 = (int)uStack_884;
          iVar21 = iStack_84;
          iStack_80 = SUB84(uStack_884,4);
          iVar22 = iStack_80;
          if (LVar8 == CellCentroid && local_d80 == 0) {
            local_538._52_4_ = local_6b8.end.z;
            local_538._56_4_ = local_6b8.ncomp;
            local_538._32_4_ = local_6b8.begin.x;
            local_538._36_4_ = local_6b8.begin.y;
            local_538._16_8_ = local_6b8.kstride;
            local_538._24_8_ = local_6b8.nstride;
            local_538._0_8_ = local_6b8.p;
            local_538._8_8_ = local_6b8.jstride;
            local_538._116_4_ = local_cc8.end.z;
            local_538._120_4_ = local_cc8.ncomp;
            local_538._80_8_ = local_cc8.kstride;
            local_538._88_8_ = local_cc8.nstride;
            local_538._64_8_ = local_cc8.p;
            local_538._72_8_ = local_cc8.jstride;
            local_538._128_8_ = local_ce8;
            *(ulong *)((long)local_d18 + 0x2c) = CONCAT44(local_a38.end.y,local_a38.end.x);
            *(undefined8 *)((long)local_d18 + 0x34) = local_a38._52_8_;
            local_d18[4] = CONCAT44(local_a38.begin.y,local_a38.begin.x);
            local_d18[5] = CONCAT44(local_a38.end.x,local_a38.begin.z);
            local_d18[2] = local_a38.kstride;
            local_d18[3] = local_a38.nstride;
            *local_d18 = (long)local_a38.p;
            local_d18[1] = local_a38.jstride;
            *(ulong *)((long)local_d20 + 0x2c) = CONCAT44(local_a78.end.y,local_a78.end.x);
            *(undefined8 *)((long)local_d20 + 0x34) = local_a78._52_8_;
            local_d20[4] = CONCAT44(local_a78.begin.y,local_a78.begin.x);
            local_d20[5] = CONCAT44(local_a78.end.x,local_a78.begin.z);
            local_d20[2] = local_a78.kstride;
            local_d20[3] = local_a78.nstride;
            *local_d20 = (long)local_a78.p;
            local_d20[1] = local_a78.jstride;
            local_538._264_8_ = local_938;
            *(ulong *)((long)local_d28 + 0x2c) = CONCAT44(local_ab8.end.y,local_ab8.end.x);
            *(undefined8 *)((long)local_d28 + 0x34) = local_ab8._52_8_;
            local_d28[4] = CONCAT44(local_ab8.begin.y,local_ab8.begin.x);
            local_d28[5] = CONCAT44(local_ab8.end.x,local_ab8.begin.z);
            local_d28[2] = local_ab8.kstride;
            local_d28[3] = local_ab8.nstride;
            *local_d28 = (long)local_ab8.p;
            local_d28[1] = local_ab8.jstride;
            local_538._336_8_ = local_948;
            *(ulong *)((long)local_d30 + 0x2c) = CONCAT44(local_af8.end.y,local_af8.end.x);
            *(undefined8 *)((long)local_d30 + 0x34) = local_af8._52_8_;
            local_d30[4] = CONCAT44(local_af8.begin.y,local_af8.begin.x);
            local_d30[5] = CONCAT44(local_af8.end.x,local_af8.begin.z);
            local_d30[2] = local_af8.kstride;
            local_d30[3] = local_af8.nstride;
            *local_d30 = (long)local_af8.p;
            local_d30[1] = local_af8.jstride;
            local_538._408_8_ = local_958;
            *(ulong *)((long)local_d38 + 0x2c) = CONCAT44(local_b38.end.y,local_b38.end.x);
            *(undefined8 *)((long)local_d38 + 0x34) = local_b38._52_8_;
            local_d38[4] = CONCAT44(local_b38.begin.y,local_b38.begin.x);
            local_d38[5] = CONCAT44(local_b38.end.x,local_b38.begin.z);
            local_d38[2] = local_b38.kstride;
            local_d38[3] = local_b38.nstride;
            *local_d38 = (long)local_b38.p;
            local_d38[1] = local_b38.jstride;
            *(ulong *)((long)local_d40 + 0x2c) = CONCAT44(local_6f8.end.y,local_6f8.end.x);
            *(undefined8 *)((long)local_d40 + 0x34) = local_6f8._52_8_;
            local_d40[4] = local_6f8.begin._0_8_;
            local_d40[5] = CONCAT44(local_6f8.end.x,local_6f8.begin.z);
            local_d40[2] = local_6f8.kstride;
            local_d40[3] = local_6f8.nstride;
            *local_d40 = local_6f8.p;
            local_d40[1] = local_6f8.jstride;
            *(ulong *)((long)local_d48 + 0x2c) = CONCAT44(local_738.end.y,local_738.end.x);
            *(undefined8 *)((long)local_d48 + 0x34) = local_738._52_8_;
            local_d48[4] = local_738.begin._0_8_;
            local_d48[5] = CONCAT44(local_738.end.x,local_738.begin.z);
            local_d48[2] = local_738.kstride;
            local_d48[3] = local_738.nstride;
            *local_d48 = local_738.p;
            local_d48[1] = local_738.jstride;
            *(ulong *)((long)local_d50 + 0x2c) = CONCAT44(local_778.end.y,local_778.end.x);
            *(undefined8 *)((long)local_d50 + 0x34) = local_778._52_8_;
            local_d50[4] = local_778.begin._0_8_;
            local_d50[5] = CONCAT44(local_778.end.x,local_778.begin.z);
            local_d50[2] = local_778.kstride;
            local_d50[3] = local_778.nstride;
            *local_d50 = local_778.p;
            local_d50[1] = local_778.jstride;
            *(ulong *)((long)local_d58 + 0x2c) = CONCAT44(local_7b8.end.y,local_7b8.end.x);
            *(undefined8 *)((long)local_d58 + 0x34) = local_7b8._52_8_;
            local_d58[4] = local_7b8.begin._0_8_;
            local_d58[5] = CONCAT44(local_7b8.end.x,local_7b8.begin.z);
            local_d58[2] = local_7b8.kstride;
            local_d58[3] = local_7b8.nstride;
            *local_d58 = local_7b8.p;
            local_d58[1] = local_7b8.jstride;
            uVar27 = local_140;
            local_538._736_4_ = local_d84;
            local_538._740_4_ = local_678;
            local_538._744_4_ = iStack_674;
            local_538._748_4_ = iStack_670;
            local_538._752_4_ = iStack_66c;
            local_538._756_4_ = local_d88;
            local_538._808_4_ = local_7f8.end.y;
            local_538._792_4_ = local_7f8.begin.x;
            local_538._796_4_ = local_7f8.begin.y;
            local_538._800_4_ = local_7f8.begin.z;
            local_538._804_4_ = local_7f8.end.x;
            local_538._784_4_ = (undefined4)local_7f8.nstride;
            local_538._788_4_ = (undefined4)((ulong)local_7f8.nstride >> 0x20);
            local_538._760_8_ = local_7f8.p;
            local_538._768_8_ = local_7f8.jstride;
            iStack_1d0 = iStack_9c8;
            local_538._856_4_ = SUB84(local_9d8,0);
            local_538._860_4_ = (undefined4)((ulong)local_9d8 >> 0x20);
            local_538[0x360] = SUB41(local_9d0,0);
            local_1d7 = SUB41((uint)local_9d0 >> 8,0);
            local_1d6 = SUB41((uint)local_9d0 >> 0x10,0);
            uStack_1d5 = (undefined1)((uint)local_9d0 >> 0x18);
            local_1d4 = local_9cc;
            local_538._840_4_ = (undefined4)local_9f8._16_8_;
            local_538._844_4_ = SUB84(local_9f8._16_8_,4);
            local_538._848_4_ = (undefined4)local_9f8._24_8_;
            local_538._852_4_ = SUB84(local_9f8._24_8_,4);
            local_538._824_8_ = local_9f8._0_8_;
            local_538._832_8_ = local_9f8._8_8_;
            iStack_190 = local_5d0.end.y;
            iStack_18c = local_5d0.end.z;
            iStack_188 = local_5d0.ncomp;
            iStack_1a0 = local_5d0.begin.x;
            iStack_19c = local_5d0.begin.y;
            iStack_198 = local_5d0.begin.z;
            local_1b0 = local_5d0.kstride;
            iStack_1a8 = (int)local_5d0.nstride;
            iStack_1a4 = (int)((ulong)local_5d0.nstride >> 0x20);
            local_1c0 = local_5d0.p;
            LStack_1b8 = local_5d0.jstride;
            bStack_150 = SUB41(iStack_8c8,0);
            bStack_14f = SUB41((uint)iStack_8c8 >> 8,0);
            uStack_14e = (undefined2)((uint)iStack_8c8 >> 0x10);
            iStack_160 = (int)local_8f8._32_8_;
            iStack_15c = SUB84(local_8f8._32_8_,4);
            iStack_158 = iStack_8d0;
            local_170 = (double *)local_8f8._16_8_;
            iStack_168 = (int)local_8f8._24_8_;
            iStack_164 = SUB84(local_8f8._24_8_,4);
            local_180 = (double *)local_8f8._0_8_;
            LStack_178 = local_8f8._8_8_;
            local_140._0_2_ = CONCAT11(iVar7 != 0,bVar35);
            local_140._5_3_ = SUB83(uVar27,5);
            local_140 = CONCAT35(local_140._5_3_,
                                 CONCAT14(uVar6,CONCAT13(uVar5,CONCAT12(uVar4,(undefined2)local_140)
                                                        ))) ^ 0x101010000;
            iStack_108 = local_838.end.y;
            iStack_118 = local_838.begin.x;
            iStack_114 = local_838.begin.y;
            iStack_110 = local_838.begin.z;
            local_128 = (double *)local_838.kstride;
            iStack_120 = (int)local_838.nstride;
            iStack_11c = (int)((ulong)local_838.nstride >> 0x20);
            local_138 = local_838.p;
            uStack_130 = local_838.jstride;
            iStack_c8 = iStack_848;
            iStack_d8 = (int)local_878._32_8_;
            iStack_d4 = SUB84(local_878._32_8_,4);
            iStack_d0 = iStack_850;
            local_e8 = (double *)local_878._16_8_;
            iStack_e0 = (int)local_878._24_8_;
            iStack_dc = SUB84(local_878._24_8_,4);
            local_f8 = (double *)local_878._0_8_;
            LStack_f0 = local_878._8_8_;
            iStack_88 = iStack_888;
            iStack_98 = (int)local_8b8._32_8_;
            iStack_94 = SUB84(local_8b8._32_8_,4);
            iStack_90 = iStack_890;
            local_a8 = (double *)local_8b8._16_8_;
            iStack_a0 = (int)local_8b8._24_8_;
            iStack_9c = SUB84(local_8b8._24_8_,4);
            local_b8 = (double *)local_8b8._0_8_;
            LStack_b0 = local_8b8._8_8_;
            iStack_48 = iStack_988;
            iStack_44 = iStack_984;
            iStack_40 = iStack_980;
            iStack_58 = (int)local_998;
            iStack_54 = (int)((ulong)local_998 >> 0x20);
            iStack_50 = local_990;
            local_4c = local_98c;
            local_68 = (double *)local_9b8._16_8_;
            iStack_60 = (int)local_9b8._24_8_;
            iStack_5c = SUB84(local_9b8._24_8_,4);
            local_78 = (double *)local_9b8._0_8_;
            uStack_70 = local_9b8._8_8_;
            Loop<amrex::mlebabeclap_adotx_centroid(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,bool_const&,bool_const&,bool_const&,bool,bool,amrex::GpuArray<double,3u>const&,double,double,int)::_lambda(int,int,int,int)_1_>
                      (&local_978,ncomp,(anon_class_1280_34_0a4fdabd *)local_538);
          }
          else {
            LVar9 = pMVar12->m_beta_loc;
            local_538._52_4_ = local_6b8.end.z;
            local_538._56_4_ = local_6b8.ncomp;
            local_538._32_4_ = local_6b8.begin.x;
            local_538._36_4_ = local_6b8.begin.y;
            local_538._16_8_ = local_6b8.kstride;
            local_538._24_8_ = local_6b8.nstride;
            local_538._0_8_ = local_6b8.p;
            local_538._8_8_ = local_6b8.jstride;
            local_538._116_4_ = local_cc8.end.z;
            local_538._120_4_ = local_cc8.ncomp;
            local_538._80_8_ = local_cc8.kstride;
            local_538._88_8_ = local_cc8.nstride;
            local_538._64_8_ = local_cc8.p;
            local_538._72_8_ = local_cc8.jstride;
            local_538._128_8_ = local_ce8;
            iStack_14c = iVar11;
            *(ulong *)((long)local_d18 + 0x2c) = CONCAT44(local_a38.end.y,local_a38.end.x);
            *(undefined8 *)((long)local_d18 + 0x34) = local_a38._52_8_;
            local_d18[4] = CONCAT44(local_a38.begin.y,local_a38.begin.x);
            local_d18[5] = CONCAT44(local_a38.end.x,local_a38.begin.z);
            local_d18[2] = local_a38.kstride;
            local_d18[3] = local_a38.nstride;
            *local_d18 = (long)local_a38.p;
            local_d18[1] = local_a38.jstride;
            *(ulong *)((long)local_d20 + 0x2c) = CONCAT44(local_a78.end.y,local_a78.end.x);
            *(undefined8 *)((long)local_d20 + 0x34) = local_a78._52_8_;
            local_d20[4] = CONCAT44(local_a78.begin.y,local_a78.begin.x);
            local_d20[5] = CONCAT44(local_a78.end.x,local_a78.begin.z);
            local_d20[2] = local_a78.kstride;
            local_d20[3] = local_a78.nstride;
            *local_d20 = (long)local_a78.p;
            local_d20[1] = local_a78.jstride;
            local_538._264_8_ = local_938;
            *(ulong *)((long)local_d28 + 0x2c) = CONCAT44(local_ab8.end.y,local_ab8.end.x);
            *(undefined8 *)((long)local_d28 + 0x34) = local_ab8._52_8_;
            local_d28[4] = CONCAT44(local_ab8.begin.y,local_ab8.begin.x);
            local_d28[5] = CONCAT44(local_ab8.end.x,local_ab8.begin.z);
            local_d28[2] = local_ab8.kstride;
            local_d28[3] = local_ab8.nstride;
            *local_d28 = (long)local_ab8.p;
            local_d28[1] = local_ab8.jstride;
            local_538._336_8_ = local_948;
            *(ulong *)((long)local_d30 + 0x2c) = CONCAT44(local_af8.end.y,local_af8.end.x);
            *(undefined8 *)((long)local_d30 + 0x34) = local_af8._52_8_;
            local_d30[4] = CONCAT44(local_af8.begin.y,local_af8.begin.x);
            local_d30[5] = CONCAT44(local_af8.end.x,local_af8.begin.z);
            local_d30[2] = local_af8.kstride;
            local_d30[3] = local_af8.nstride;
            *local_d30 = (long)local_af8.p;
            local_d30[1] = local_af8.jstride;
            local_538._408_8_ = local_958;
            *(ulong *)((long)local_d38 + 0x2c) = CONCAT44(local_b38.end.y,local_b38.end.x);
            *(undefined8 *)((long)local_d38 + 0x34) = local_b38._52_8_;
            local_d38[4] = CONCAT44(local_b38.begin.y,local_b38.begin.x);
            local_d38[5] = CONCAT44(local_b38.end.x,local_b38.begin.z);
            local_d38[2] = local_b38.kstride;
            local_d38[3] = local_b38.nstride;
            *local_d38 = (long)local_b38.p;
            local_d38[1] = local_b38.jstride;
            *(ulong *)((long)local_d40 + 0x2c) = CONCAT44(local_6f8.end.y,local_6f8.end.x);
            *(undefined8 *)((long)local_d40 + 0x34) = local_6f8._52_8_;
            local_d40[4] = local_6f8.begin._0_8_;
            local_d40[5] = CONCAT44(local_6f8.end.x,local_6f8.begin.z);
            local_d40[2] = local_6f8.kstride;
            local_d40[3] = local_6f8.nstride;
            *local_d40 = local_6f8.p;
            local_d40[1] = local_6f8.jstride;
            *(ulong *)((long)local_d48 + 0x2c) = CONCAT44(local_738.end.y,local_738.end.x);
            *(undefined8 *)((long)local_d48 + 0x34) = local_738._52_8_;
            local_d48[4] = local_738.begin._0_8_;
            local_d48[5] = CONCAT44(local_738.end.x,local_738.begin.z);
            local_d48[2] = local_738.kstride;
            local_d48[3] = local_738.nstride;
            *local_d48 = local_738.p;
            local_d48[1] = local_738.jstride;
            *(ulong *)((long)local_d50 + 0x2c) = CONCAT44(local_778.end.y,local_778.end.x);
            *(undefined8 *)((long)local_d50 + 0x34) = local_778._52_8_;
            local_d50[4] = local_778.begin._0_8_;
            local_d50[5] = CONCAT44(local_778.end.x,local_778.begin.z);
            local_d50[2] = local_778.kstride;
            local_d50[3] = local_778.nstride;
            *local_d50 = local_778.p;
            local_d50[1] = local_778.jstride;
            *(ulong *)((long)local_d58 + 0x2c) = CONCAT44(local_7b8.end.y,local_7b8.end.x);
            *(undefined8 *)((long)local_d58 + 0x34) = local_7b8._52_8_;
            local_d58[4] = local_7b8.begin._0_8_;
            local_d58[5] = CONCAT44(local_7b8.end.x,local_7b8.begin.z);
            local_d58[2] = local_7b8.kstride;
            local_d58[3] = local_7b8.nstride;
            *local_d58 = local_7b8.p;
            local_d58[1] = local_7b8.jstride;
            local_538._784_4_ = local_7f8.end.y;
            local_538._768_4_ = local_7f8.begin.x;
            local_538._772_4_ = local_7f8.begin.y;
            local_538._776_4_ = local_7f8.begin.z;
            local_538._780_4_ = local_7f8.end.x;
            local_538._760_8_ = local_7f8.nstride;
            local_538._736_4_ = SUB84(local_7f8.p,0);
            local_538._740_4_ = (undefined4)((ulong)local_7f8.p >> 0x20);
            local_538._744_4_ = (undefined4)local_7f8.jstride;
            local_538._748_4_ = (undefined4)((ulong)local_7f8.jstride >> 0x20);
            local_538._848_4_ = local_590.end.y;
            local_538._852_4_ = local_590.end.z;
            local_538._856_4_ = local_590.ncomp;
            local_538._832_4_ = local_590.begin.x;
            local_538._836_4_ = local_590.begin.y;
            local_538._840_4_ = local_590.begin.z;
            local_538._844_4_ = local_590.end.x;
            local_538._816_4_ = (undefined4)local_590.kstride;
            local_538._820_4_ = (undefined4)((ulong)local_590.kstride >> 0x20);
            local_538._824_8_ = local_590.nstride;
            local_538._800_4_ = SUB84(local_590.p,0);
            local_538._804_4_ = (undefined4)((ulong)local_590.p >> 0x20);
            local_538._808_4_ = (undefined4)local_590.jstride;
            local_538._812_4_ = (undefined4)((ulong)local_590.jstride >> 0x20);
            local_1d6 = LVar9 == FaceCentroid;
            local_538[0x360] = !local_1d6;
            iStack_1a0 = local_838.end.y;
            local_1b0._0_4_ = local_838.begin.x;
            local_1b0._4_4_ = local_838.begin.y;
            iStack_1a8 = local_838.begin.z;
            iStack_1a4 = local_838.end.x;
            local_1c0 = (double *)local_838.kstride;
            LStack_1b8 = local_838.nstride;
            iStack_1d0 = (int)local_838.p;
            iStack_1cc = (int)((ulong)local_838.p >> 0x20);
            iStack_1c8 = (int)local_838.jstride;
            uStack_1c4 = (undefined4)((ulong)local_838.jstride >> 0x20);
            iStack_160 = iStack_848;
            local_170 = (double *)local_878._32_8_;
            iStack_168 = iStack_850;
            iStack_164 = iStack_84c;
            local_180 = (double *)local_878._16_8_;
            LStack_178 = local_878._24_8_;
            iStack_190 = (int)local_878._0_8_;
            iStack_18c = SUB84(local_878._0_8_,4);
            iStack_188 = (int)local_878._8_8_;
            uStack_184 = SUB84(local_878._8_8_,4);
            iStack_118 = iStack_9c8;
            local_128 = local_9d8;
            iStack_120 = local_9d0;
            iStack_11c = local_9cc;
            local_138 = (double *)local_9f8._16_8_;
            uStack_130 = local_9f8._24_8_;
            iStack_148 = (int)local_9f8._0_8_;
            uStack_144 = SUB84(local_9f8._0_8_,4);
            local_140 = local_9f8._8_8_;
            iStack_d8 = iStack_8c8;
            local_e8 = (double *)local_8f8._32_8_;
            iStack_e0 = iStack_8d0;
            iStack_dc = iStack_8cc;
            local_f8 = (double *)local_8f8._16_8_;
            LStack_f0 = local_8f8._24_8_;
            iStack_108 = (int)local_8f8._0_8_;
            iStack_104 = SUB84(local_8f8._0_8_,4);
            iStack_100 = (int)local_8f8._8_8_;
            uStack_fc = SUB84(local_8f8._8_8_,4);
            iStack_98 = iStack_888;
            local_a8 = (double *)local_8b8._32_8_;
            iStack_a0 = iStack_890;
            iStack_9c = iStack_88c;
            local_b8 = (double *)local_8b8._16_8_;
            LStack_b0 = local_8b8._24_8_;
            iStack_c8 = (int)local_8b8._0_8_;
            iStack_c4 = SUB84(local_8b8._0_8_,4);
            iStack_c0 = (int)local_8b8._8_8_;
            uStack_bc = SUB84(local_8b8._8_8_,4);
            iStack_58 = iStack_988;
            iStack_54 = (int)_iStack_984;
            iStack_50 = SUB84(_iStack_984,4);
            local_68 = local_998;
            iStack_60 = local_990;
            iStack_5c = local_98c;
            local_78 = (double *)local_9b8._16_8_;
            uStack_70 = local_9b8._24_8_;
            iStack_88 = (int)local_9b8._0_8_;
            iStack_84 = SUB84(local_9b8._0_8_,4);
            iStack_80 = (int)local_9b8._8_8_;
            uStack_7c = SUB84(local_9b8._8_8_,4);
            local_538._752_4_ = uVar13;
            local_538._756_4_ = uVar14;
            local_538._788_4_ = uVar15;
            local_538._792_4_ = uVar16;
            local_1d7 = LVar8 != CellCentroid;
            iStack_19c = iVar17;
            iStack_198 = iVar18;
            iStack_15c = iVar19;
            iStack_158 = iVar20;
            bStack_150 = bVar35;
            bStack_14f = iVar7 != 0;
            iStack_114 = iVar30;
            iStack_110 = iVar10;
            iStack_d4 = iVar28;
            iStack_d0 = iVar32;
            iStack_94 = iVar21;
            iStack_90 = iVar22;
            Loop<amrex::mlebabeclap_adotx(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,bool,amrex::Array4<double_const>const&,bool,amrex::GpuArray<double,3u>const&,double,double,int,bool,bool)::_lambda(int,int,int,int)_1_>
                      (&local_978,ncomp,(anon_class_1264_28_cfe7304b *)local_538);
          }
        }
      }
      MFIter::operator++(&local_630);
    } while (local_630.currentIndex < local_630.endIndex);
  }
  MFIter::~MFIter(&local_630);
  return;
}

Assistant:

void
MLEBABecLap::Fapply (int amrlev, int mglev, MultiFab& out, const MultiFab& in) const
{
    BL_PROFILE("MLEBABecLap::Fapply()");

    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);
    const iMultiFab& ccmask = m_cc_mask[amrlev][mglev];

    const auto dxinvarr = m_geom[amrlev][mglev].InvCellSizeArray();

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    auto fcent = (factory) ? factory->getFaceCent()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    const MultiCutFab* barea = (factory) ? &(factory->getBndryArea()) : nullptr;
    const MultiCutFab* bcent = (factory) ? &(factory->getBndryCent()) : nullptr;
    const auto         ccent = (factory) ? &(factory->getCentroid()) : nullptr;

    const bool is_eb_dirichlet =  isEBDirichlet();
    const bool is_eb_inhomog = m_is_eb_inhomog;

    const int ncomp = getNComp();

    Array4<Real const> foo;

    const Real ascalar = m_a_scalar;
    const Real bscalar = m_b_scalar;

    const Box& domain_box = m_geom[amrlev][mglev].Domain();

    AMREX_D_TERM(
        const int domlo_x = domain_box.smallEnd(0);
        const int domhi_x = domain_box.bigEnd(0);,
        const int domlo_y = domain_box.smallEnd(1);
        const int domhi_y = domain_box.bigEnd(1);,
        const int domlo_z = domain_box.smallEnd(2);
        const int domhi_z = domain_box.bigEnd(2););

    AMREX_D_TERM(
        const bool extdir_x = !(m_geom[amrlev][mglev].isPeriodic(0));,
        const bool extdir_y = !(m_geom[amrlev][mglev].isPeriodic(1));,
        const bool extdir_z = !(m_geom[amrlev][mglev].isPeriodic(2)););

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(out, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real const> const& xfab = in.const_array(mfi);
        Array4<Real> const& yfab = out.array(mfi);
        Array4<Real const> const& afab = acoef.const_array(mfi);
        AMREX_D_TERM(Array4<Real const> const& bxfab = bxcoef.const_array(mfi);,
                     Array4<Real const> const& byfab = bycoef.const_array(mfi);,
                     Array4<Real const> const& bzfab = bzcoef.const_array(mfi););

        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;

        if (fabtyp == FabType::covered) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, ncomp, i, j, k, n,
            {
                yfab(i,j,k,n) = 0.0;
            });
        } else if (fabtyp == FabType::regular) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, ncomp, i, j, k, n,
            {
                mlabeclap_adotx(i,j,k,n, yfab, xfab, afab,
                                AMREX_D_DECL(bxfab,byfab,bzfab),
                                dxinvarr, ascalar, bscalar);
            });
        } else {
            Array4<int const> const& ccmfab = ccmask.const_array(mfi);
            Array4<EBCellFlag const> const& flagfab = flags->const_array(mfi);
            Array4<Real const> const& vfracfab = vfrac->const_array(mfi);
            AMREX_D_TERM(Array4<Real const> const& apxfab = area[0]->const_array(mfi);,
                         Array4<Real const> const& apyfab = area[1]->const_array(mfi);,
                         Array4<Real const> const& apzfab = area[2]->const_array(mfi););
            AMREX_D_TERM(Array4<Real const> const& fcxfab = fcent[0]->const_array(mfi);,
                         Array4<Real const> const& fcyfab = fcent[1]->const_array(mfi);,
                         Array4<Real const> const& fczfab = fcent[2]->const_array(mfi););
            Array4<Real const> const& bafab = barea->const_array(mfi);
            Array4<Real const> const& bcfab = bcent->const_array(mfi);
            Array4<Real const> const& ccfab = ccent->const_array(mfi);
            Array4<Real const> const& bebfab = (is_eb_dirichlet)
                ? m_eb_b_coeffs[amrlev][mglev]->const_array(mfi) : foo;
            Array4<Real const> const& phiebfab = (is_eb_dirichlet && is_eb_inhomog)
                ? m_eb_phi[amrlev]->const_array(mfi) : foo;

            bool beta_on_centroid = (m_beta_loc == Location::FaceCentroid);
            bool  phi_on_centroid = (m_phi_loc  == Location::CellCentroid);

            bool treat_phi_as_on_centroid = ( phi_on_centroid && (mglev == 0) );

            if (treat_phi_as_on_centroid) {
#ifdef AMREX_USE_HIP
                // This causes an abort in HIP 4.5 but works in earlier versions
                // A follow-up release should fix this.
                // Error message:
                //   lld: error: ran out of registers during register allocation
                amrex::Abort("MLEBABecLap::Fapply: phi on centroid not supported for HIP");
                amrex::ignore_unused(AMREX_D_DECL(domlo_x, domlo_y, domlo_z),
                                     AMREX_D_DECL(domhi_x, domhi_y, domhi_z),
                                     AMREX_D_DECL(extdir_x, extdir_y, extdir_z));
                amrex::ignore_unused(ccfab);
#else
               AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
               {
                   mlebabeclap_adotx_centroid(tbx, yfab, xfab, afab, AMREX_D_DECL(bxfab,byfab,bzfab),
                                     flagfab, vfracfab,
                                     AMREX_D_DECL(apxfab,apyfab,apzfab),
                                     AMREX_D_DECL(fcxfab,fcyfab,fczfab),
                                     ccfab, bafab, bcfab, bebfab, phiebfab,
                                     AMREX_D_DECL(domlo_x, domlo_y, domlo_z),
                                     AMREX_D_DECL(domhi_x, domhi_y, domhi_z),
                                     AMREX_D_DECL(extdir_x, extdir_y, extdir_z),
                                     is_eb_dirichlet, is_eb_inhomog, dxinvarr,
                                     ascalar, bscalar, ncomp);
               });
#endif
            } else {
               AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
               {
                   mlebabeclap_adotx(tbx, yfab, xfab, afab, AMREX_D_DECL(bxfab,byfab,bzfab),
                                     ccmfab, flagfab, vfracfab,
                                     AMREX_D_DECL(apxfab,apyfab,apzfab),
                                     AMREX_D_DECL(fcxfab,fcyfab,fczfab),
                                     bafab, bcfab, bebfab,
                                     is_eb_dirichlet,
                                     phiebfab,
                                     is_eb_inhomog, dxinvarr,
                                     ascalar, bscalar, ncomp, beta_on_centroid, phi_on_centroid);
               });
            }
        }
    }
}